

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_16::NameResolver::VisitFunc(NameResolver *this,Func *func)

{
  BindingHash *this_00;
  anon_class_16_2_3f26e8f3 local_48;
  DuplicateCallback local_38;
  Func *local_18;
  Func *func_local;
  NameResolver *this_local;
  
  this->current_func_ = func;
  local_18 = func;
  func_local = (Func *)this;
  if (((func->decl).has_func_type & 1U) != 0) {
    ResolveFuncTypeVar(this,&(func->decl).type_var);
  }
  this_00 = &local_18->bindings;
  local_48.func = local_18;
  local_48.this = this;
  std::
  function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>
  ::function<wabt::(anonymous_namespace)::NameResolver::VisitFunc(wabt::Func*)::__0,void>
            ((function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>
              *)&local_38,&local_48);
  BindingHash::FindDuplicates(this_00,&local_38);
  std::
  function<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&)>
  ::~function(&local_38);
  ExprVisitor::VisitFunc(&this->visitor_,local_18);
  this->current_func_ = (Func *)0x0;
  return;
}

Assistant:

void NameResolver::VisitFunc(Func* func) {
  current_func_ = func;
  if (func->decl.has_func_type) {
    ResolveFuncTypeVar(&func->decl.type_var);
  }

  func->bindings.FindDuplicates([func, this](const BindingHash::value_type& a,
                                             const BindingHash::value_type& b) {
    const char* desc =
        (a.second.index < func->GetNumParams()) ? "parameter" : "local";
    PrintDuplicateBindingsError(a, b, desc);
  });

  visitor_.VisitFunc(func);
  current_func_ = nullptr;
}